

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame.cpp
# Opt level: O1

int32 __thiscall rw::Frame::count(Frame *this)

{
  Frame *pFVar1;
  Frame *f;
  int32 count;
  int32 local_14;
  
  local_14 = 1;
  if (this->child != (Frame *)0x0) {
    f = this->child;
    do {
      pFVar1 = f->next;
      countCB(f,&local_14);
      f = pFVar1;
    } while (pFVar1 != (Frame *)0x0);
  }
  return local_14;
}

Assistant:

int32
Frame::count(void)
{
	int32 count = 1;
	this->forAllChildren(countCB, (void*)&count);
	return count;
}